

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_init(fpstate *fpptr)

{
  long lVar1;
  
  fpptr->comptype = 0xb;
  fpptr->quantize_level = 4.0;
  fpptr->no_dither = 0;
  fpptr->dither_offset = 0;
  fpptr->dither_method = 1;
  fpptr->n3ratio = 2.0;
  fpptr->n3min = 6.0;
  fpptr->scale = 0.0;
  fpptr->rescale_noise = 0.0;
  fpptr->smooth = 0;
  fpptr->int_to_float = 0;
  fpptr->ntile[0] = -1;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    fpptr->ntile[lVar1 + 1] = 1;
  }
  fpptr->do_not_prompt = 0;
  fpptr->to_stdout = 0;
  fpptr->listonly = 0;
  fpptr->clobber = 0;
  fpptr->delete_input = 0;
  fpptr->do_checksums = 1;
  fpptr->do_gzip_file = 0;
  fpptr->do_images = 1;
  fpptr->do_tables = 0;
  fpptr->extname[0] = '\0';
  fpptr->delete_suffix = 0;
  fpptr->outfile[0] = '\0';
  fpptr->test_all = 0;
  fpptr->verbose = 0;
  fpptr->prefix[0] = '\0';
  fpptr->firstfile = 1;
  fpptr->initialized = 0x2a;
  fpptr->preflight_checked = 0;
  return 0;
}

Assistant:

int fp_init (fpstate *fpptr)
{
	int	ii;

	fpptr->comptype = RICE_1;
	fpptr->quantize_level = DEF_QLEVEL;
        fpptr->no_dither = 0;
        fpptr->dither_method = 1;
        fpptr->dither_offset = 0;
        fpptr->int_to_float = 0;

	/* thresholds when using the -i2f flag */
        fpptr->n3ratio = 2.0;  /* minimum ratio of image noise sigma / q */
        fpptr->n3min = 6.;     /* minimum noise sigma. */

	fpptr->scale = DEF_HCOMP_SCALE;
	fpptr->smooth = DEF_HCOMP_SMOOTH;
	fpptr->rescale_noise = DEF_RESCALE_NOISE;
	fpptr->ntile[0] = (long) -1;	/* -1 means extent of axis */

	for (ii=1; ii < MAX_COMPRESS_DIM; ii++)
	    fpptr->ntile[ii] = (long) 1;

	fpptr->to_stdout = 0;
	fpptr->listonly = 0;
	fpptr->clobber = 0;
	fpptr->delete_input = 0;
	fpptr->do_not_prompt = 0;
	fpptr->do_checksums = 1;
	fpptr->do_gzip_file = 0;
	fpptr->do_tables = 0;  /* this is intended for testing purposes  */
	fpptr->do_images = 1;  /* can be turned off with -tableonly switch */
	fpptr->test_all = 0;
	fpptr->verbose = 0;

	fpptr->prefix[0] = 0;
	fpptr->extname[0] = 0;
	fpptr->delete_suffix = 0;
	fpptr->outfile[0] = 0;

	fpptr->firstfile = 1;

	/* magic number for initialization check, boolean for preflight
	 */
	fpptr->initialized = FP_INIT_MAGIC;
	fpptr->preflight_checked = 0;
	return(0);
}